

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O1

ptr<force_vote_msg> __thiscall nuraft::force_vote_msg::deserialize(force_vote_msg *this,buffer *buf)

{
  undefined8 *puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<force_vote_msg> pVar2;
  buffer_serializer bs;
  buffer_serializer local_30;
  
  *(undefined8 *)this = 0;
  puVar1 = (undefined8 *)operator_new(0x18);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_006208c8;
  *(undefined8 **)(this + 8) = puVar1;
  *(undefined8 **)this = puVar1 + 2;
  buffer_serializer::buffer_serializer(&local_30,buf,LITTLE);
  buffer_serializer::get_u8(&local_30);
  pVar2.super___shared_ptr<nuraft::force_vote_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar2.super___shared_ptr<nuraft::force_vote_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<force_vote_msg>)
         pVar2.super___shared_ptr<nuraft::force_vote_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<force_vote_msg> force_vote_msg::deserialize(buffer& buf) {
    ptr<force_vote_msg> ret = cs_new<force_vote_msg>();
    buffer_serializer bs(buf);
    uint8_t version = bs.get_u8();
    (void)version;
    return ret;
}